

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

void round_shift_4x4_avx2(__m256i *in,int shift)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  uint uVar5;
  uint in_ESI;
  undefined1 (*in_RDI) [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  __m256i rnding;
  char local_294;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  if (in_ESI != 0) {
    local_294 = (char)in_ESI;
    uVar5 = 1 << (local_294 - 1U & 0x1f);
    auVar7 = vpinsrd_avx(ZEXT416(uVar5),uVar5,1);
    auVar7 = vpinsrd_avx(auVar7,uVar5,2);
    auVar7 = vpinsrd_avx(auVar7,uVar5,3);
    auVar6 = vpinsrd_avx(ZEXT416(uVar5),uVar5,1);
    auVar6 = vpinsrd_avx(auVar6,uVar5,2);
    auVar6 = vpinsrd_avx(auVar6,uVar5,3);
    auVar6 = ZEXT116(0) * auVar7 + ZEXT116(1) * auVar6;
    auVar7 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar7;
    uStack_70 = auVar7._0_8_;
    uStack_68 = auVar7._8_8_;
    auVar4._16_8_ = uStack_70;
    auVar4._0_16_ = auVar6;
    auVar4._24_8_ = uStack_68;
    auVar1 = vpaddd_avx2(*in_RDI,auVar4);
    *in_RDI = auVar1;
    auVar3._16_8_ = uStack_70;
    auVar3._0_16_ = auVar6;
    auVar3._24_8_ = uStack_68;
    auVar1 = vpaddd_avx2(in_RDI[1],auVar3);
    in_RDI[1] = auVar1;
    auVar2._16_8_ = uStack_70;
    auVar2._0_16_ = auVar6;
    auVar2._24_8_ = uStack_68;
    auVar1 = vpaddd_avx2(in_RDI[2],auVar2);
    in_RDI[2] = auVar1;
    auVar1._16_8_ = uStack_70;
    auVar1._0_16_ = auVar6;
    auVar1._24_8_ = uStack_68;
    auVar1 = vpaddd_avx2(in_RDI[3],auVar1);
    in_RDI[3] = auVar1;
    auVar1 = vpsrad_avx2(*in_RDI,ZEXT416(in_ESI));
    *in_RDI = auVar1;
    auVar1 = vpsrad_avx2(in_RDI[1],ZEXT416(in_ESI));
    in_RDI[1] = auVar1;
    auVar1 = vpsrad_avx2(in_RDI[2],ZEXT416(in_ESI));
    in_RDI[2] = auVar1;
    auVar1 = vpsrad_avx2(in_RDI[3],ZEXT416(in_ESI));
    in_RDI[3] = auVar1;
  }
  return;
}

Assistant:

static inline void round_shift_4x4_avx2(__m256i *in, int shift) {
  if (shift != 0) {
    __m256i rnding = _mm256_set1_epi32(1 << (shift - 1));
    in[0] = _mm256_add_epi32(in[0], rnding);
    in[1] = _mm256_add_epi32(in[1], rnding);
    in[2] = _mm256_add_epi32(in[2], rnding);
    in[3] = _mm256_add_epi32(in[3], rnding);

    in[0] = _mm256_srai_epi32(in[0], shift);
    in[1] = _mm256_srai_epi32(in[1], shift);
    in[2] = _mm256_srai_epi32(in[2], shift);
    in[3] = _mm256_srai_epi32(in[3], shift);
  }
}